

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void sortOpts(StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptMap,
             SmallVectorImpl<std::pair<const_char_*,_llvm::cl::Option_*>_> *Opts,bool ShowHidden)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  pair<const_char_*,_llvm::cl::Option_*> *Start;
  ushort uVar3;
  iterator I;
  SmallPtrSet<llvm::cl::Option_*,_32U> OptionSet;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_170;
  pair<llvm::SmallPtrSetIterator<llvm::cl::Option_*>,_bool> local_168;
  SmallPtrSetImplBase local_150;
  void *local_130 [32];
  
  local_150.SmallArray = local_130;
  local_150.CurArraySize = 0x20;
  local_150.NumNonEmpty = 0;
  local_150.NumTombstones = 0;
  local_150.CurArray = local_150.SmallArray;
  local_170.Ptr =
       (StringMapEntryBase **)
       llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin(OptMap);
  uVar1 = (OptMap->super_StringMapImpl).NumBuckets;
  ppSVar2 = (OptMap->super_StringMapImpl).TheTable;
  while (local_170.Ptr != ppSVar2 + uVar1) {
    uVar3 = *(ushort *)&((Option *)(*local_170.Ptr)[1].StrLen)->field_0xc >> 5 & 3;
    if ((uVar3 != 1 || ShowHidden) && uVar3 != 2) {
      llvm::SmallPtrSetImpl<llvm::cl::Option_*>::insert
                (&local_168,(SmallPtrSetImpl<llvm::cl::Option_*> *)&local_150,
                 (Option *)(*local_170.Ptr)[1].StrLen);
      if (local_168.second == true) {
        local_168.first.super_SmallPtrSetIteratorImpl.Bucket = (void **)(*local_170.Ptr + 2);
        local_168.first.super_SmallPtrSetIteratorImpl.End = (void **)(*local_170.Ptr)[1].StrLen;
        llvm::SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>::push_back
                  (&Opts->
                    super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                   ,(pair<const_char_*,_llvm::cl::Option_*> *)&local_168);
      }
    }
    llvm::
    StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
    ::operator++(&local_170);
  }
  Start = (pair<const_char_*,_llvm::cl::Option_*> *)
          (Opts->super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>).
          super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>.
          super_SmallVectorBase.BeginX;
  llvm::array_pod_sort<std::pair<char_const*,llvm::cl::Option*>*>
            (Start,Start + (Opts->
                           super_SmallVectorTemplateBase<std::pair<const_char_*,_llvm::cl::Option_*>,_true>
                           ).
                           super_SmallVectorTemplateCommon<std::pair<const_char_*,_llvm::cl::Option_*>,_void>
                           .super_SmallVectorBase.Size,OptNameCompare);
  llvm::SmallPtrSetImplBase::~SmallPtrSetImplBase(&local_150);
  return;
}

Assistant:

static void sortOpts(StringMap<Option *> &OptMap,
                     SmallVectorImpl<std::pair<const char *, Option *>> &Opts,
                     bool ShowHidden) {
  SmallPtrSet<Option *, 32> OptionSet; // Duplicate option detection.

  for (StringMap<Option *>::iterator I = OptMap.begin(), E = OptMap.end();
       I != E; ++I) {
    // Ignore really-hidden options.
    if (I->second->getOptionHiddenFlag() == ReallyHidden)
      continue;

    // Unless showhidden is set, ignore hidden flags.
    if (I->second->getOptionHiddenFlag() == Hidden && !ShowHidden)
      continue;

    // If we've already seen this option, don't add it to the list again.
    if (!OptionSet.insert(I->second).second)
      continue;

    Opts.push_back(
        std::pair<const char *, Option *>(I->getKey().data(), I->second));
  }

  // Sort the options list alphabetically.
  array_pod_sort(Opts.begin(), Opts.end(), OptNameCompare);
}